

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O1

list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> * __thiscall
imrt::Station::closeBeamlet_abi_cxx11_
          (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
           *__return_storage_ptr__,Station *this,int beam,int aperture,bool lside)

{
  size_t *psVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  pair<int,_int> pVar6;
  _List_node_base *p_Var7;
  long lVar8;
  int *piVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> local_48;
  
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>)._M_impl.
  _M_node._M_size = 0;
  bVar4 = isActiveBeamlet(this,beam);
  if ((bVar4) && (bVar4 = isOpenBeamlet(this,beam,aperture), bVar4)) {
    pVar6 = Collimator::indexToPos(this->collimator,beam,this->angle);
    iVar5 = pVar6.first;
    lVar8 = *(long *)&(this->A).
                      super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[aperture].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    piVar9 = (int *)(lVar8 + (long)iVar5 * 8);
    lVar10 = (long)iVar5 * 8;
    iVar11 = pVar6.second;
    if (lside) {
      iVar12 = *piVar9;
      if (iVar12 <= iVar11) {
        iVar13 = -1;
        do {
          dVar2 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[aperture];
          p_Var7 = (_List_node_base *)operator_new(0x20);
          *(int *)&p_Var7[1]._M_next = iVar12 + (beam - iVar11) + iVar13 + 1;
          p_Var7[1]._M_prev = (_List_node_base *)((ulong)dVar2 ^ 0x8000000000000000);
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &(__return_storage_ptr__->
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          lVar8 = *(long *)&(this->A).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data;
          iVar12 = *(int *)(lVar8 + lVar10);
          iVar13 = iVar13 + 1;
        } while (iVar13 < iVar11 - iVar12);
      }
      uVar3 = *(undefined8 *)(lVar8 + lVar10);
      (this->last_mem).first.first = aperture;
      (this->last_mem).first.second = iVar5;
      (this->last_mem).second.first = (int)uVar3;
      (this->last_mem).second.second = (int)((ulong)uVar3 >> 0x20);
      if (*(int *)(lVar8 + 4 + lVar10) == iVar11) {
        *(undefined8 *)(lVar8 + lVar10) = 0xffffffffffffffff;
      }
      else {
        *(int *)(lVar8 + lVar10) = iVar11 + 1;
      }
    }
    else {
      if (iVar11 <= piVar9[1]) {
        iVar12 = -1;
        do {
          dVar2 = (this->intensity).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[aperture];
          p_Var7 = (_List_node_base *)operator_new(0x20);
          *(int *)&p_Var7[1]._M_next = beam + iVar12 + 1;
          p_Var7[1]._M_prev = (_List_node_base *)((ulong)dVar2 ^ 0x8000000000000000);
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &(__return_storage_ptr__->
                    super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    )._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
          lVar8 = *(long *)&(this->A).
                            super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[aperture].
                            super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                            ._M_impl.super__Vector_impl_data;
          iVar12 = iVar12 + 1;
        } while (iVar12 < *(int *)(lVar8 + 4 + lVar10) - iVar11);
        piVar9 = (int *)(lVar8 + lVar10);
      }
      uVar3 = *(undefined8 *)piVar9;
      (this->last_mem).first.first = aperture;
      (this->last_mem).first.second = iVar5;
      (this->last_mem).second.first = (int)uVar3;
      (this->last_mem).second.second = (int)((ulong)uVar3 >> 0x20);
      if (*piVar9 == iVar11) {
        piVar9[0] = -1;
        piVar9[1] = -1;
      }
      else {
        piVar9[1] = iVar11 + -1;
      }
    }
    std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::list
              (&local_48,__return_storage_ptr__);
    updateIntensity(this,&local_48);
    while (local_48.
           super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_48) {
      p_Var7 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                &(local_48.
                  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
      operator_delete(local_48.
                      super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl._M_node.super__List_node_base._M_next);
      local_48.super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = p_Var7;
    }
  }
  if (&this->last_diff != __return_storage_ptr__) {
    std::__cxx11::list<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
    _M_assign_dispatch<std::_List_const_iterator<std::pair<int,double>>>
              ((list<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)&this->last_diff
               ,(__return_storage_ptr__->
                super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>).
                _M_impl._M_node.super__List_node_base._M_next,__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

list<pair <int,double> > Station::closeBeamlet(int beam, int aperture, bool lside) {
    
    list<pair <int, double> > diff;
    //cout << "Attempt to close beam: " << beam << " from left? " << lside << endl;
    //cout << "active: " << isActiveBeamlet(beam) << "open: " << isOpenBeamlet(beam, aperture) << endl;

    if (isActiveBeamlet(beam) && isOpenBeamlet(beam, aperture)) {
      auto coord = collimator.indexToPos(beam, angle);
      int row= coord.first;
      //cout << "Coordinates: " << coord.first << "," << coord.second << endl;
      if (lside) {
        //cout << "lside" << endl;
        for (int i=0;i<=coord.second-A[aperture][row].first;i++) {
          diff.push_back(make_pair(beam-(coord.second-A[aperture][row].first)+i, -intensity[aperture]));
          //cout << "el diff es " << beam-(coord.second-A[aperture][row].first)+i <<"," << -intensity[aperture] << endl; 
        }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
        if (A[aperture][row].second == coord.second) {
          A[aperture][row].first = -1;
          A[aperture][row].second = -1;
        } else {
          A[aperture][row].first = coord.second+1;
        }
      } else {
        for (int i=0;i<=A[aperture][row].second-coord.second;i++) {
          diff.push_back(make_pair(beam+i, -intensity[aperture]));
	      }
        last_mem = make_pair(make_pair(aperture,row), A[aperture][row]);
	      if (A[aperture][row].first == coord.second) {
	        A[aperture][row].first=-1;
	        A[aperture][row].second=-1;
	      } else {
          A[aperture][row].second=coord.second-1;
        }
      }
      updateIntensity(diff);
    }
    last_diff=diff;
    return(diff);
  }